

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

void Gia_ManReprFromAigRepr(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  void *pvVar3;
  Gia_Rpr_t *pGVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ed,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ee,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->nObjs - pGia->vCos->nSize != pAig->vObjs->nSize - (pAig->nDeleted + pAig->nObjs[3])) {
    __assert_fail("Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ef,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  pGVar4 = (Gia_Rpr_t *)calloc((long)pGia->nObjs,4);
  pGia->pReprs = pGVar4;
  if (0 < pGia->nObjs) {
    lVar5 = 0;
    do {
      pGia->pReprs[lVar5] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar5] | 0xfffffff);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pGia->nObjs);
  }
  if (0 < pGia->nObjs) {
    lVar5 = 8;
    lVar7 = 0;
    do {
      pGVar2 = pGia->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(uint *)((long)pGVar2 + lVar5 + -8);
      if (-1 < (int)uVar8 || (~uVar8 & 0x1fffffff) == 0) {
        if (lVar7 != 0) {
          if ((int)*(uint *)(&pGVar2->field_0x0 + lVar5) < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((*(uint *)(&pGVar2->field_0x0 + lVar5) & 1) != 0) {
            __assert_fail("i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                          ,0x1f8,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
          }
        }
        if ((int)*(uint *)(&pGVar2->field_0x0 + lVar5) < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar8 = *(uint *)(&pGVar2->field_0x0 + lVar5) >> 1;
        if (pAig->vObjs->nSize <= (int)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(int *)((long)pAig->vObjs->pArray[uVar8] + 0x28) = (int)lVar7;
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar7 < pGia->nObjs);
  }
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar5];
      if (((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x18) & 7) != 3)) &&
         (pAig->pReprs[lVar5] != (Aig_Obj_t *)0x0)) {
        iVar1 = *(int *)((long)pvVar3 + 0x28);
        uVar8 = (pAig->pReprs[lVar5]->field_5).iData;
        if ((uVar8 != 0xfffffff) && (iVar1 <= (int)uVar8)) {
          __assert_fail("Num == GIA_VOID || Num < Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
        }
        pGia->pReprs[iVar1] =
             (Gia_Rpr_t)((uint)pGia->pReprs[iVar1] & 0xf0000000 | uVar8 & 0xfffffff);
      }
      lVar5 = lVar5 + 1;
      pVVar9 = pAig->vObjs;
    } while (lVar5 < pVVar9->nSize);
  }
  piVar6 = Gia_ManDeriveNexts(pGia);
  pGia->pNexts = piVar6;
  return;
}

Assistant:

void Gia_ManReprFromAigRepr( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObjGia; 
    Aig_Obj_t * pObjAig, * pReprAig;
    int i;
    assert( pAig->pReprs != NULL );
    assert( pGia->pReprs == NULL );
    assert( Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig) );
    pGia->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pGia) );
    for ( i = 0; i < Gia_ManObjNum(pGia); i++ )
        Gia_ObjSetRepr( pGia, i, GIA_VOID );
    // move pointers from GIA to AIG
    Gia_ManForEachObj( pGia, pObjGia, i )
    {
        if ( Gia_ObjIsCo(pObjGia) )
            continue;
        assert( i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia)) );
        pObjAig  = Aig_ManObj( pAig, Abc_Lit2Var(Gia_ObjValue(pObjGia)) );
        pObjAig->iData = i;
    }
    Aig_ManForEachObj( pAig, pObjAig, i )
    {
        if ( Aig_ObjIsCo(pObjAig) )
            continue;
        if ( pAig->pReprs[i] == NULL )
            continue;
        pReprAig = pAig->pReprs[i];
        Gia_ObjSetRepr( pGia, pObjAig->iData, pReprAig->iData );
    }
    pGia->pNexts = Gia_ManDeriveNexts( pGia );
}